

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O3

bool __thiscall
crnlib::dxt1_endpoint_optimizer::try_alpha_as_black_optimization(dxt1_endpoint_optimizer *this)

{
  byte bVar1;
  byte bVar2;
  uint min_new_capacity;
  results *prVar3;
  unique_color *puVar4;
  params *ppVar5;
  color_quad_u8 *__src;
  bool bVar6;
  bool bVar7;
  bool bVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  vector<crnlib::color_quad<unsigned_char,_int>_> trial_colors;
  color_quad_u8 c [4];
  vector<unsigned_char> trial_selectors;
  params trial_params;
  elemental_vector local_a8;
  color_quad_u8 local_98 [4];
  elemental_vector local_88;
  params local_78;
  results local_50;
  undefined2 uVar8;
  
  uVar14 = (this->m_unique_colors).m_size;
  if ((ulong)uVar14 != 0) {
    prVar3 = this->m_pResults;
    puVar4 = (this->m_unique_colors).m_p;
    uVar11 = 0;
    uVar10 = 0;
    do {
      if ((puVar4[uVar11].m_color.field_0.field_0.r < 5) &&
         (puVar4[uVar11].m_color.field_0.field_0.g < 5)) {
        uVar10 = uVar10 + (puVar4[uVar11].m_color.field_0.field_0.b < 5);
      }
      uVar11 = uVar11 + 1;
    } while (uVar14 != uVar11);
    if (uVar10 != uVar14 && uVar10 != 0) {
      ppVar5 = this->m_pParams;
      local_78.m_endpoint_caching = ppVar5->m_endpoint_caching;
      local_78.m_use_transparent_indices_for_black = ppVar5->m_use_transparent_indices_for_black;
      local_78.m_force_alpha_blocks = ppVar5->m_force_alpha_blocks;
      local_78._35_5_ = *(undefined5 *)&ppVar5->field_0x23;
      local_78.m_block_index = ppVar5->m_block_index;
      local_78._4_4_ = *(undefined4 *)&ppVar5->field_0x4;
      local_78.m_pPixels = ppVar5->m_pPixels;
      local_78.m_num_pixels = ppVar5->m_num_pixels;
      local_78.m_dxt1a_alpha_threshold = ppVar5->m_dxt1a_alpha_threshold;
      local_78.m_quality = ppVar5->m_quality;
      local_78.m_pixels_have_alpha = ppVar5->m_pixels_have_alpha;
      bVar6 = ppVar5->m_use_alpha_blocks;
      bVar7 = ppVar5->m_perceptual;
      bVar9 = ppVar5->m_grayscale_sampling;
      uVar8 = CONCAT11(bVar9,bVar7);
      local_78._29_3_ = CONCAT21(uVar8,bVar6);
      local_a8.m_p = (color_quad_u8 *)0x0;
      local_a8.m_size = 0;
      local_a8.m_capacity = 0;
      uVar14 = ppVar5->m_num_pixels;
      if ((ulong)uVar14 == 0) {
        local_78.m_pPixels = (color_quad_u8 *)0x0;
        local_78.m_pixels_have_alpha = true;
      }
      else {
        __src = ppVar5->m_pPixels;
        elemental_vector::increase_capacity(&local_a8,uVar14,true,4,(object_mover)0x0,false);
        local_a8.m_size = uVar14;
        memcpy(local_a8.m_p,__src,(ulong)uVar14 << 2);
        local_78.m_pPixels = (color_quad_u8 *)local_a8.m_p;
        local_78.m_pixels_have_alpha = true;
        if (local_a8.m_size != 0) {
          uVar11 = 0;
          do {
            if ((((((color_quad_u8 *)((long)local_a8.m_p + uVar11 * 4))->field_0).field_0.r < 5) &&
                ((((color_quad_u8 *)((long)local_a8.m_p + uVar11 * 4))->field_0).field_0.g < 5)) &&
               ((((color_quad_u8 *)((long)local_a8.m_p + uVar11 * 4))->field_0).field_0.b < 5)) {
              (((color_quad_u8 *)((long)local_a8.m_p + uVar11 * 4))->field_0).field_0.a = '\0';
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < (local_a8._8_8_ & 0xffffffff));
        }
      }
      min_new_capacity = this->m_pParams->m_num_pixels;
      local_88.m_p = (uint8 *)0x0;
      local_88.m_size = 0;
      local_88.m_capacity = 0;
      local_a8.m_p = local_78.m_pPixels;
      if (min_new_capacity != 0) {
        elemental_vector::increase_capacity
                  (&local_88,min_new_capacity,min_new_capacity == 1,1,(object_mover)0x0,false);
        memset((uint8 *)((long)local_88.m_p + (local_88._8_8_ & 0xffffffff)),0,
               (ulong)(min_new_capacity - local_88.m_size));
        local_88.m_size = min_new_capacity;
      }
      local_50.m_pSelectors = (uint8 *)local_88.m_p;
      compute_internal(this,&local_78,&local_50);
      dxt1_block::get_block_colors3(local_98,local_50.m_low_color,local_50.m_high_color);
      if ((local_a8._8_8_ & 0xffffffff) == 0) {
        uVar11 = 0;
      }
      else {
        uVar12 = 0;
        uVar11 = 0;
        do {
          bVar1 = *(byte *)((long)local_88.m_p + uVar12);
          bVar2 = (((color_quad_u8 *)((long)local_a8.m_p + uVar12 * 4))->field_0).field_0.g;
          if (this->m_perceptual == false) {
            if (this->m_pParams->m_grayscale_sampling == true) {
              iVar13 = ((uint)(((color_quad_u8 *)((long)local_a8.m_p + uVar12 * 4))->field_0).
                              field_0.b * 0x1d2f + 0x8000 +
                        (uint)bVar2 * 0x9646 +
                        (uint)(((color_quad_u8 *)((long)local_a8.m_p + uVar12 * 4))->field_0).
                              field_0.r * 0x4c8b >> 0x10) -
                       ((uint)local_98[bVar1].field_0.field_0.b * 0x1d2f + 0x8000 +
                        (uint)local_98[bVar1].field_0.field_0.g * 0x9646 +
                        (uint)local_98[bVar1].field_0.field_0.r * 0x4c8b >> 0x10);
              uVar14 = iVar13 * iVar13;
            }
            else {
              iVar13 = (uint)(((color_quad_u8 *)((long)local_a8.m_p + uVar12 * 4))->field_0).field_0
                             .r - (uint)local_98[bVar1].field_0.field_0.r;
              iVar15 = (uint)(((color_quad_u8 *)((long)local_a8.m_p + uVar12 * 4))->field_0).field_0
                             .b - (uint)local_98[bVar1].field_0.field_0.b;
              iVar16 = (uint)bVar2 - (uint)local_98[bVar1].field_0.field_0.g;
              uVar14 = iVar15 * iVar15 + iVar16 * iVar16 + iVar13 * iVar13;
            }
          }
          else {
            iVar15 = (uint)(((color_quad_u8 *)((long)local_a8.m_p + uVar12 * 4))->field_0).field_0.r
                     - (uint)local_98[bVar1].field_0.field_0.r;
            iVar13 = (uint)(((color_quad_u8 *)((long)local_a8.m_p + uVar12 * 4))->field_0).field_0.b
                     - (uint)local_98[bVar1].field_0.field_0.b;
            iVar16 = (uint)bVar2 - (uint)local_98[bVar1].field_0.field_0.g;
            uVar14 = iVar13 * iVar13 + iVar16 * iVar16 * 0x19 + iVar15 * iVar15 * 8;
          }
          uVar11 = uVar11 + uVar14;
          uVar12 = uVar12 + 1;
        } while ((local_a8._8_8_ & 0xffffffff) != uVar12);
      }
      if (uVar11 < prVar3->m_error) {
        prVar3->m_error = uVar11;
        prVar3->m_low_color = local_50.m_low_color;
        prVar3->m_high_color = local_50.m_high_color;
        if (prVar3->m_pSelectors != (uint8 *)0x0) {
          memcpy(prVar3->m_pSelectors,local_50.m_pSelectors,(ulong)this->m_pParams->m_num_pixels);
        }
        prVar3->m_alpha_block = true;
      }
      if ((uint8 *)local_88.m_p != (uint8 *)0x0) {
        crnlib_free(local_88.m_p);
      }
      if ((color_quad_u8 *)local_a8.m_p != (color_quad_u8 *)0x0) {
        crnlib_free(local_a8.m_p);
      }
    }
  }
  return true;
}

Assistant:

bool dxt1_endpoint_optimizer::try_alpha_as_black_optimization()
    {
        results* pOrig_results = m_pResults;

        uint num_dark_colors = 0;

        for (uint i = 0; i < m_unique_colors.size(); i++)
        {
            if ((m_unique_colors[i].m_color[0] <= 4) && (m_unique_colors[i].m_color[1] <= 4) && (m_unique_colors[i].m_color[2] <= 4))
            {
                num_dark_colors++;
            }
        }

        if ((!num_dark_colors) || (num_dark_colors == m_unique_colors.size()))
        {
            return true;
        }

        params trial_params(*m_pParams);
        crnlib::vector<color_quad_u8> trial_colors;
        trial_colors.insert(0, m_pParams->m_pPixels, m_pParams->m_num_pixels);

        trial_params.m_pPixels = trial_colors.get_ptr();
        trial_params.m_pixels_have_alpha = true;

        for (uint i = 0; i < trial_colors.size(); i++)
        {
            if ((trial_colors[i][0] <= 4) && (trial_colors[i][1] <= 4) && (trial_colors[i][2] <= 4))
            {
                trial_colors[i][3] = 0;
            }
        }

        results trial_results;

        crnlib::vector<uint8> trial_selectors(m_pParams->m_num_pixels);
        trial_results.m_pSelectors = trial_selectors.get_ptr();

        compute_internal(trial_params, trial_results);

        CRNLIB_ASSERT(trial_results.m_alpha_block);

        color_quad_u8 c[4];
        dxt1_block::get_block_colors3(c, trial_results.m_low_color, trial_results.m_high_color);

        uint64 trial_error = 0;

        for (uint i = 0; i < trial_colors.size(); i++)
        {
            if (trial_colors[i][3] == 0)
            {
                CRNLIB_ASSERT(trial_selectors[i] == 3);
            }
            else
            {
                CRNLIB_ASSERT(trial_selectors[i] != 3);
            }

            trial_error += color_distance(m_perceptual, trial_colors[i], c[trial_selectors[i]], false);
        }

        if (trial_error < pOrig_results->m_error)
        {
            pOrig_results->m_error = trial_error;

            pOrig_results->m_low_color = trial_results.m_low_color;
            pOrig_results->m_high_color = trial_results.m_high_color;

            if (pOrig_results->m_pSelectors)
            {
                memcpy(pOrig_results->m_pSelectors, trial_results.m_pSelectors, m_pParams->m_num_pixels);
            }

            pOrig_results->m_alpha_block = true;
        }

        return true;
    }